

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcTable.c
# Opt level: O2

void Bdc_TableAdd(Bdc_Man_t *p,Bdc_Fun_t *pFunc)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Bdc_Fun_t **ppBVar4;
  int iVar5;
  Bdc_Fun_t *pBVar6;
  uint uVar7;
  ulong uVar8;
  
  ppBVar4 = p->pTable;
  uVar1 = pFunc->uSupp;
  uVar8 = (ulong)uVar1;
  pBVar6 = ppBVar4[uVar8];
  if (pBVar6 == (Bdc_Fun_t *)0x0) {
    pVVar2 = p->vSpots;
    iVar5 = pVVar2->nSize;
    if (iVar5 == pVVar2->nCap) {
      uVar7 = 0x10;
      if (0xf < iVar5) {
        uVar7 = iVar5 * 2;
      }
      if (iVar5 < (int)uVar7) {
        if (pVVar2->pArray == (int *)0x0) {
          piVar3 = (int *)malloc((ulong)uVar7 << 2);
        }
        else {
          piVar3 = (int *)realloc(pVVar2->pArray,(ulong)uVar7 << 2);
        }
        pVVar2->pArray = piVar3;
        if (piVar3 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar2->nCap = uVar7;
        iVar5 = pVVar2->nSize;
        ppBVar4 = p->pTable;
      }
    }
    pVVar2->nSize = iVar5 + 1;
    pVVar2->pArray[iVar5] = uVar1;
    uVar8 = (ulong)pFunc->uSupp;
    pBVar6 = ppBVar4[uVar8];
  }
  pFunc->pNext = pBVar6;
  ppBVar4[uVar8] = pFunc;
  return;
}

Assistant:

void Bdc_TableAdd( Bdc_Man_t * p, Bdc_Fun_t * pFunc )
{
    if ( p->pTable[pFunc->uSupp] == NULL )
        Vec_IntPush( p->vSpots, pFunc->uSupp );
    pFunc->pNext = p->pTable[pFunc->uSupp];
    p->pTable[pFunc->uSupp] = pFunc;
}